

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O0

quaternion dja::operator*(quaternion *a,quaternion *b)

{
  float fVar1;
  float fVar2;
  float_t fVar3;
  vec3 vVar4;
  vec3 local_c8;
  vec3 local_b8;
  vec3 local_a8;
  vec3 local_98;
  vec3 local_88;
  vec3 local_78;
  vec3 local_68;
  vec3 local_58;
  vec3 local_48;
  undefined1 local_38 [8];
  vec3 im;
  float_t re;
  quaternion *b_local;
  quaternion *a_local;
  
  fVar1 = a->re;
  fVar2 = b->re;
  unique0x1000013b = b;
  fVar3 = dot(&a->im,&b->im);
  im.y = fVar1 * fVar2 - fVar3;
  vVar4 = operator*(a->re,&stack0xffffffffffffffd8->im);
  local_68.z = vVar4.z;
  local_58.z = local_68.z;
  local_68._0_8_ = vVar4._0_8_;
  local_58.x = local_68.x;
  local_58.y = local_68.y;
  local_68 = vVar4;
  vVar4 = operator*(&a->im,stack0xffffffffffffffd8->re);
  local_88.z = vVar4.z;
  local_78.z = local_88.z;
  local_88._0_8_ = vVar4._0_8_;
  local_78.x = local_88.x;
  local_78.y = local_88.y;
  local_88 = vVar4;
  vVar4 = operator+(&local_58,&local_78);
  local_98.z = vVar4.z;
  local_48.z = local_98.z;
  local_98._0_8_ = vVar4._0_8_;
  local_48.x = local_98.x;
  local_48.y = local_98.y;
  local_98 = vVar4;
  vVar4 = cross(&a->im,&stack0xffffffffffffffd8->im);
  local_b8.z = vVar4.z;
  local_a8.z = local_b8.z;
  local_b8._0_8_ = vVar4._0_8_;
  local_a8.x = local_b8.x;
  local_a8.y = local_b8.y;
  vVar4 = operator+(&local_48,&local_a8);
  local_c8.z = vVar4.z;
  im.x = local_c8.z;
  local_c8._0_8_ = vVar4._0_8_;
  local_38._0_4_ = local_c8.x;
  local_38._4_4_ = local_c8.y;
  quaternion::quaternion((quaternion *)&a_local,im.y,(vec3 *)local_38);
  return _a_local;
}

Assistant:

Q OP*(const Q& a, const Q& b) {
    V1 re = a.re * b.re - dot(a.im, b.im);
    V3 im = a.re * b.im + a.im * b.re + cross(a.im, b.im);
    return Q(re, im);
}